

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeVerifyPhaseOne(Gia_Man_t *p,Vec_Int_t *vAdds,int iBox)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  long lVar8;
  int i;
  char *__format;
  uint *puVar9;
  int local_48;
  
  iVar7 = iBox * 6;
  iVar1 = Vec_IntEntry(vAdds,iVar7 + 2);
  local_48 = 0;
  if (iVar1 < 1) {
    local_48 = Acec_SignBit2(vAdds,iBox,2);
  }
  Gia_ManIncrementTravId(p);
  puVar9 = &DAT_0084211c;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    iVar2 = Vec_IntEntry(vAdds,iVar7 + (int)lVar8);
    if (iVar2 != 0) {
      pGVar6 = Gia_ManObj(p,iVar2);
      iVar2 = Acec_SignBit2(vAdds,iBox,(int)lVar8);
      uVar5 = ~*puVar9 & 0xff;
      if (iVar2 == local_48) {
        uVar5 = *puVar9;
      }
      pGVar6->Value = uVar5;
      Gia_ObjSetTravIdCurrent(p,pGVar6);
    }
    puVar9 = puVar9 + 1;
  }
  i = iVar7 + 3;
  iVar2 = Vec_IntEntry(vAdds,i);
  pGVar6 = Gia_ManObj(p,iVar2);
  uVar3 = Acec_TreeVerifyPhaseOne_rec(p,pGVar6);
  iVar2 = Acec_SignBit2(vAdds,iBox,3);
  uVar5 = ~uVar3 & 0xff;
  if (iVar2 == local_48) {
    uVar5 = uVar3;
  }
  iVar2 = Vec_IntEntry(vAdds,iVar7 + 4);
  pGVar6 = Gia_ManObj(p,iVar2);
  uVar4 = Acec_TreeVerifyPhaseOne_rec(p,pGVar6);
  iVar2 = Acec_SignBit2(vAdds,iBox,4);
  uVar3 = ~uVar4 & 0xff;
  if (iVar2 == local_48) {
    uVar3 = uVar4;
  }
  if (iVar1 < 1) {
    if (uVar5 != 0x66) {
      uVar5 = Vec_IntEntry(vAdds,i);
      printf("Hadd %d sum %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar5);
    }
    if (uVar3 == 0x88) {
      return;
    }
    __format = "Hadd %d carry %d is wrong.\n";
  }
  else {
    if (uVar5 != 0x96) {
      uVar5 = Vec_IntEntry(vAdds,i);
      printf("Fadd %d sum %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar5);
    }
    if (uVar3 == 0xe8) {
      return;
    }
    __format = "Fadd %d carry %d is wrong.\n";
  }
  uVar5 = Vec_IntEntry(vAdds,iVar7 + 4);
  printf(__format,(ulong)(uint)iBox,(ulong)uVar5);
  return;
}

Assistant:

void Acec_TreeVerifyPhaseOne( Gia_Man_t * p, Vec_Int_t * vAdds, int iBox )
{
    Gia_Obj_t * pObj;
    unsigned TruthXor, TruthMaj, Truths[3] = { 0xAA, 0xCC, 0xF0 };
    int k, iObj, fFadd = Vec_IntEntry(vAdds, 6*iBox+2) > 0;
    int fFlip = !fFadd && Acec_SignBit2(vAdds, iBox, 2);

    Gia_ManIncrementTravId( p );
    for ( k = 0; k < 3; k++ )
    {
        iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        pObj = Gia_ManObj( p, iObj );
        pObj->Value = (Acec_SignBit2(vAdds, iBox, k) ^ fFlip) ? 0xFF & ~Truths[k] : Truths[k];
        Gia_ObjSetTravIdCurrent( p, pObj );
    }

    iObj = Vec_IntEntry( vAdds, 6*iBox+3 );
    TruthXor = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthXor = (Acec_SignBit2(vAdds, iBox, 3) ^ fFlip) ? 0xFF & ~TruthXor : TruthXor;

    iObj = Vec_IntEntry( vAdds, 6*iBox+4 );
    TruthMaj = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthMaj = (Acec_SignBit2(vAdds, iBox, 4) ^ fFlip) ? 0xFF & ~TruthMaj : TruthMaj;

    if ( fFadd ) // FADD
    {
        if ( TruthXor != 0x96 )
            printf( "Fadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0xE8 )
            printf( "Fadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
    else
    {
        //printf( "Sign1 = %d%d%d %d\n", Acec_SignBit(vAdds, iBox, 0), Acec_SignBit(vAdds, iBox, 1), Acec_SignBit(vAdds, iBox, 2), Acec_SignBit(vAdds, iBox, 3) );
        //printf( "Sign2 = %d%d%d %d%d\n", Acec_SignBit2(vAdds, iBox, 0), Acec_SignBit2(vAdds, iBox, 1), Acec_SignBit2(vAdds, iBox, 2), Acec_SignBit2(vAdds, iBox, 3), Acec_SignBit2(vAdds, iBox, 4) );
        if ( TruthXor != 0x66 )
            printf( "Hadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0x88 )
            printf( "Hadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
}